

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O1

void __thiscall TPZPrInteg<TPZIntTriang>::GetOrder(TPZPrInteg<TPZIntTriang> *this,TPZVec<int> *ord)

{
  int iVar1;
  int *piVar2;
  
  if (ord->fNElements < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
               ,0x54);
    return;
  }
  iVar1 = (this->super_TPZIntTriang).fOrdKsi;
  piVar2 = ord->fStore;
  *piVar2 = iVar1;
  piVar2[1] = iVar1;
  piVar2[2] = this->fOrdKsi;
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }